

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmframe.cpp
# Opt level: O1

void __thiscall VMFrameStack::~VMFrameStack(VMFrameStack *this)

{
  BlockHeader *pBVar1;
  BlockHeader *pBVar2;
  VMFrame *pVVar3;
  
  do {
    pVVar3 = PopFrame(this);
  } while (pVVar3 != (VMFrame *)0x0);
  pBVar2 = this->Blocks;
  while (pBVar2 != (BlockHeader *)0x0) {
    pBVar1 = pBVar2->NextBlock;
    operator_delete__(pBVar2);
    pBVar2 = pBVar1;
  }
  pBVar2 = this->UnusedBlocks;
  while (pBVar2 != (BlockHeader *)0x0) {
    pBVar1 = pBVar2->NextBlock;
    operator_delete__(pBVar2);
    pBVar2 = pBVar1;
  }
  this->Blocks = (BlockHeader *)0x0;
  this->UnusedBlocks = (BlockHeader *)0x0;
  return;
}

Assistant:

VMFrameStack::~VMFrameStack()
{
	while (PopFrame() != NULL)
	{ }
	if (Blocks != NULL)
	{
		BlockHeader *block, *next;
		for (block = Blocks; block != NULL; block = next)
		{
			next = block->NextBlock;
			delete[] (VM_UBYTE *)block;
		}
	}
	if (UnusedBlocks != NULL)
	{
		BlockHeader *block, *next;
		for (block = UnusedBlocks; block != NULL; block = next)
		{
			next = block->NextBlock;
			delete[] (VM_UBYTE *)block;
		}
	}
	Blocks = NULL;
	UnusedBlocks = NULL;
}